

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O3

CURLcode Curl_auth_decode_ntlm_type2_message(Curl_easy *data,bufref *type2ref,ntlmdata *ntlm)

{
  curl_trc_feat *pcVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  size_t sVar6;
  uchar *puVar7;
  void *pvVar8;
  CURLcode CVar9;
  
  plVar5 = (long *)Curl_bufref_ptr(type2ref);
  sVar6 = Curl_bufref_len(type2ref);
  ntlm->flags = 0;
  if (((sVar6 < 0x20) || (*plVar5 != 0x5053534d4c544e)) || ((int)plVar5[1] != 2)) {
    CVar9 = CURLE_BAD_CONTENT_ENCODING;
LAB_0016a3ae:
    if (data == (Curl_easy *)0x0) {
      return CVar9;
    }
LAB_0016a3b3:
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
      Curl_infof(data,"NTLM handshake failure (bad type-2 message)");
    }
  }
  else {
    uVar3 = Curl_read32_le((uchar *)((long)plVar5 + 0x14));
    ntlm->flags = uVar3;
    *(long *)ntlm->nonce = plVar5[3];
    if ((uVar3 >> 0x17 & 1) == 0) {
      return CURLE_OK;
    }
    puVar7 = Curl_bufref_ptr(type2ref);
    sVar6 = Curl_bufref_len(type2ref);
    CVar9 = CURLE_OK;
    uVar3 = 0;
    if (0x2f < sVar6) {
      uVar2 = Curl_read16_le(puVar7 + 0x28);
      uVar3 = (uint)uVar2;
      uVar4 = Curl_read32_le(puVar7 + 0x2c);
      if (uVar2 == 0) {
        uVar3 = 0;
      }
      else {
        if ((sVar6 < uVar4) || (uVar4 < 0x30 || sVar6 < uVar4 + uVar3)) {
          CVar9 = CURLE_BAD_CONTENT_ENCODING;
          if (data == (Curl_easy *)0x0) {
            return CURLE_BAD_CONTENT_ENCODING;
          }
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(data,
                       "NTLM handshake failure (bad type-2 message). Target Info Offset Len is set incorrect by the peer"
                      );
          }
          goto LAB_0016a3b3;
        }
        (*Curl_cfree)(ntlm->target_info);
        pvVar8 = Curl_memdup(puVar7 + uVar4,(ulong)uVar3);
        ntlm->target_info = pvVar8;
        if (pvVar8 == (void *)0x0) {
          CVar9 = CURLE_OUT_OF_MEMORY;
          goto LAB_0016a3ae;
        }
      }
    }
    ntlm->target_info_len = uVar3;
  }
  return CVar9;
}

Assistant:

CURLcode Curl_auth_decode_ntlm_type2_message(struct Curl_easy *data,
                                             const struct bufref *type2ref,
                                             struct ntlmdata *ntlm)
{
  static const char type2_marker[] = { 0x02, 0x00, 0x00, 0x00 };

  /* NTLM type-2 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x02000000)
           12    Target Name            security buffer
           20    Flags                  long
           24    Challenge              8 bytes
          (32)   Context                8 bytes (two consecutive longs) (*)
          (40)   Target Information     security buffer (*)
          (48)   OS Version Structure   8 bytes (*)
  32 (48) (56)   Start of data block    (*)
                                        (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  const unsigned char *type2 = Curl_bufref_ptr(type2ref);
  size_t type2len = Curl_bufref_len(type2ref);

#if defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void)data;
#endif

  ntlm->flags = 0;

  if((type2len < 32) ||
     (memcmp(type2, NTLMSSP_SIGNATURE, 8) != 0) ||
     (memcmp(type2 + 8, type2_marker, sizeof(type2_marker)) != 0)) {
    /* This was not a good enough type-2 message */
    infof(data, "NTLM handshake failure (bad type-2 message)");
    return CURLE_BAD_CONTENT_ENCODING;
  }

  ntlm->flags = Curl_read32_le(&type2[20]);
  memcpy(ntlm->nonce, &type2[24], 8);

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_TARGET_INFO) {
    result = ntlm_decode_type2_target(data, type2ref, ntlm);
    if(result) {
      infof(data, "NTLM handshake failure (bad type-2 message)");
      return result;
    }
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE2 header flags=0x%08.8lx ", ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n                  nonce=");
    ntlm_print_hex(stderr, (char *)ntlm->nonce, 8);
    fprintf(stderr, "\n****\n");
    fprintf(stderr, "**** Header %s\n ", header);
  });

  return result;
}